

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O2

int __thiscall TPZFMatrix<double>::Decompose_LU(TPZFMatrix<double> *this)

{
  int iVar1;
  list<long,_std::allocator<long>_> fake;
  _List_base<long,_std::allocator<long>_> local_20;
  
  local_20._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_20;
  local_20._M_impl._M_node._M_size = 0;
  local_20._M_impl._M_node.super__List_node_base._M_prev =
       local_20._M_impl._M_node.super__List_node_base._M_next;
  iVar1 = (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x16])();
  std::__cxx11::_List_base<long,_std::allocator<long>_>::_M_clear(&local_20);
  return iVar1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU() {
    
    std::list<int64_t> fake;
    return this->Decompose_LU(fake);
}